

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
embree::ImageT<embree::Col4<unsigned_char>_>::set
          (ImageT<embree::Col4<unsigned_char>_> *this,size_t x,size_t y,Color4 *c)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  Col4<unsigned_char> CVar10;
  int iVar13;
  int iVar14;
  undefined1 auVar12 [16];
  int iVar15;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar9;
  undefined6 uVar11;
  
  auVar12 = minps((undefined1  [16])c->field_0,_DAT_00250e40);
  auVar12 = maxps(auVar12,ZEXT816(0));
  iVar8 = (int)(auVar12._0_4_ * 255.0);
  iVar13 = (int)(auVar12._4_4_ * 255.0);
  iVar14 = (int)(auVar12._8_4_ * 255.0);
  iVar15 = (int)(auVar12._12_4_ * 255.0);
  sVar5 = (short)iVar8;
  cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar8 - (0xff < sVar5);
  sVar5 = (short)((uint)iVar8 >> 0x10);
  sVar7 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar8 >> 0x10) - (0xff < sVar5),
                   cVar1);
  sVar5 = (short)iVar13;
  cVar2 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar13 - (0xff < sVar5);
  sVar5 = (short)((uint)iVar13 >> 0x10);
  uVar9 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar13 >> 0x10) - (0xff < sVar5),
                   CONCAT12(cVar2,sVar7));
  sVar5 = (short)iVar14;
  cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar14 - (0xff < sVar5);
  sVar5 = (short)((uint)iVar14 >> 0x10);
  uVar11 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar14 >> 0x10) - (0xff < sVar5),
                    CONCAT14(cVar3,uVar9));
  sVar5 = (short)iVar15;
  cVar4 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar15 - (0xff < sVar5);
  sVar6 = (short)((uint)iVar15 >> 0x10);
  sVar5 = (short)((uint)uVar9 >> 0x10);
  CVar10.g = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
  CVar10.r = (0 < sVar7) * (sVar7 < 0x100) * cVar1 - (0xff < sVar7);
  sVar5 = (short)((uint6)uVar11 >> 0x20);
  CVar10.b = (0 < sVar5) * (sVar5 < 0x100) * cVar3 - (0xff < sVar5);
  sVar5 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar15 >> 0x10) -
                           (0xff < sVar6),CONCAT16(cVar4,uVar11)) >> 0x30);
  CVar10.a = (0 < sVar5) * (sVar5 < 0x100) * cVar4 - (0xff < sVar5);
  this->data[y * (this->super_Image).width + x] = CVar10;
  return;
}

Assistant:

__forceinline void set(size_t x, size_t y, const Color4& c) { 
      c.set(data[y*width+x]); 
    }